

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopInvariantCodeMotion.cpp
# Opt level: O3

void __thiscall wasm::LoopInvariantCodeMotion::visitLoop(LoopInvariantCodeMotion *this,Loop *loop)

{
  size_t *psVar1;
  __node_base_ptr *this_00;
  Id *pIVar2;
  int iVar3;
  PassRunner *pPVar4;
  pointer puVar5;
  bool bVar6;
  iterator __begin7;
  size_t __n;
  LocalSet *pLVar7;
  Expression *pEVar8;
  Block *this_01;
  Expression **ppEVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar10;
  ulong extraout_RDX_02;
  long lVar11;
  LoopInvariantCodeMotion *this_02;
  ulong uVar12;
  char cVar13;
  __node_base_ptr p_Var14;
  LocalSet *pLVar15;
  optional<wasm::Type> type_;
  optional<wasm::Type> type;
  undefined1 local_518 [8];
  EffectAnalyzer effectsSoFar;
  EffectAnalyzer loopEffects;
  LoopSets loopSets;
  FindAll<wasm::LocalSet> finder;
  long local_1e0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1d8;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_1a8;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_178;
  char local_148;
  char local_147;
  char local_146;
  char local_145;
  char local_144;
  char local_143;
  char local_142;
  char local_141;
  char local_13e;
  char local_13d;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_120;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_f0;
  _Hash_node_base *local_c0;
  LocalSet *set_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> numSetsForIndex;
  LocalSet *local_98;
  LocalSet *set;
  pointer local_88;
  LoopInvariantCodeMotion *local_80;
  undefined1 auStack_78 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> movedCode;
  _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *p_Stack_58;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> work;
  Expression *local_38;
  Expression *curr;
  
  auStack_78 = (undefined1  [8])0x0;
  movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar4 = (this->
           super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
           ).super_Pass.runner;
  effectsSoFar._0_8_ =
       (this->
       super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
       ).
       super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
       .
       super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
       .
       super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
       .currModule;
  local_518[0] = (pPVar4->options).ignoreImplicitTraps;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.localsRead;
  local_518[1] = (pPVar4->options).trapsNeverHappen;
  effectsSoFar.module._0_4_ = (((Module *)effectsSoFar._0_8_)->features).features;
  effectsSoFar.module._4_2_ = 0;
  effectsSoFar.localsRead._M_t._M_impl._0_4_ = 0;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.localsWritten;
  effectsSoFar.localsWritten._M_t._M_impl._0_4_ = 0;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.mutableGlobalsRead;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.globalsWritten;
  effectsSoFar.globalsWritten._M_t._M_impl._0_4_ = 0;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.breakTargets;
  effectsSoFar.breakTargets._M_t._M_impl._0_4_ = 0;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.readsMemory = false;
  effectsSoFar.writesMemory = false;
  effectsSoFar.readsTable = false;
  effectsSoFar.writesTable = false;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  effectsSoFar.trap = false;
  effectsSoFar.implicitTrap = false;
  effectsSoFar.isAtomic = false;
  effectsSoFar.throws_ = false;
  effectsSoFar._228_4_ = 0;
  effectsSoFar.tryDepth._0_7_ = 0;
  effectsSoFar._239_4_ = 0;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&effectsSoFar.delegateTargets;
  effectsSoFar.delegateTargets._M_t._M_impl._0_4_ = 0;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)
             &effectsSoFar.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &pPVar4->options,(Module *)effectsSoFar._0_8_,(Expression *)loop);
  __n = Function::getNumLocals
                  ((this->
                   super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                   ).
                   super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                   .
                   super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                   .
                   super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                   .currFunction);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&set_1,__n,
             (allocator_type *)&loopSets._M_h._M_single_bucket);
  loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&loopSets._M_h._M_rehash_policy._M_next_resize;
  loopSets._M_h._M_buckets = (__buckets_ptr)0x1;
  loopSets._M_h._M_bucket_count = 0;
  loopSets._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  loopSets._M_h._M_element_count._0_4_ = 0x3f800000;
  loopSets._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  loopSets._M_h._M_rehash_policy._4_4_ = 0;
  loopSets._M_h._M_rehash_policy._M_next_resize = 0;
  local_80 = this;
  FindAll<wasm::LocalSet>::FindAll
            ((FindAll<wasm::LocalSet> *)&loopSets._M_h._M_single_bucket,(Expression *)loop);
  numSetsForIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)loop;
  if (loopSets._M_h._M_single_bucket !=
      (__node_base_ptr)
      finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    psVar1 = &loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var14 = loopSets._M_h._M_single_bucket;
    do {
      local_98 = (LocalSet *)p_Var14->_M_nxt;
      pIVar2 = &(set_1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id +
               (ulong)local_98->index * 4;
      *(int *)pIVar2 = *(int *)pIVar2 + 1;
      p_Stack_58 = (_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)psVar1;
      std::
      _Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<wasm::LocalSet*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::LocalSet*,false>>>>
                ((_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)psVar1,&stack0xffffffffffffff68,&p_Stack_58);
      p_Var14 = p_Var14 + 1;
    } while (p_Var14 !=
             (__node_base_ptr)
             finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  this_02 = local_80;
  puVar5 = numSetsForIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (loopSets._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    operator_delete(loopSets._M_h._M_single_bucket,
                    CONCAT26(finder.list.
                             super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish._6_2_,
                             CONCAT15(finder.list.
                                      super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._5_1_,
                                      CONCAT14(finder.list.
                                               super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._4_1_,
                                               finder.list.
                                               super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._0_4_))) -
                    (long)loopSets._M_h._M_single_bucket);
  }
  p_Stack_58 = (_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)0x0;
  work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  loopSets._M_h._M_single_bucket = (__node_base_ptr)(puVar5 + 8);
  std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
  emplace_back<wasm::Expression**>
            ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)&p_Stack_58,
             (Expression ***)&loopSets._M_h._M_single_bucket);
  uVar10 = extraout_RDX;
  if (p_Stack_58 ==
      (_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
       *)work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
         super__Vector_impl_data._M_start) {
LAB_00945f1d:
    if (auStack_78 !=
        (undefined1  [8])
        movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      loopSets._M_h._M_single_bucket =
           (__node_base_ptr)
           (this_02->
           super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
           ).
           super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
           .
           super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
           .
           super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
           .currModule;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar10;
      this_01 = Builder::
                makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                          ((Builder *)&loopSets._M_h._M_single_bucket,
                           (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                           auStack_78,type);
      puVar5 = numSetsForIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(this_01->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)
                 numSetsForIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           *(_Storage<wasm::Type,_true> *)(puVar5 + 2);
      Block::finalize(this_01,type_,Unknown);
      Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>::
      replaceCurrent((Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                      *)&(this_02->
                         super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                         ).
                         super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                     ,(Expression *)this_01);
      ppEVar9 = SmallVector<wasm::Expression_*,_10UL>::back
                          (&(this_02->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                            .expressionStack);
      *ppEVar9 = (Expression *)this_01;
    }
    if (p_Stack_58 !=
        (_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
         *)0x0) {
      operator_delete(p_Stack_58,
                      (long)work.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)p_Stack_58);
    }
    std::
    _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (set_1 != (LocalSet *)0x0) {
      operator_delete(set_1,(long)numSetsForIndex.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)set_1);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&loopEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&loopEffects.danglingPop);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&loopEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&loopEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&loopEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&loopEffects.features);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&effectsSoFar.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&effectsSoFar.danglingPop);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&effectsSoFar.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count
               );
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&effectsSoFar.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&effectsSoFar.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&effectsSoFar.features);
    if (auStack_78 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_78,
                      (long)movedCode.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
    }
    return;
  }
  this_00 = &loopSets._M_h._M_single_bucket;
LAB_00945b11:
  ppEVar9 = work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
            _M_impl.super__Vector_impl_data._M_start[-1];
  work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
  super__Vector_impl_data._M_start =
       work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
       super__Vector_impl_data._M_start + -1;
  pEVar8 = *ppEVar9;
  local_38 = pEVar8;
  if (pEVar8->_id == BlockId) {
    uVar12 = (ulong)(uint)pEVar8[2].type.id;
    this_02 = local_80;
    if (uVar12 != 0) {
      lVar11 = uVar12 * 8 + -8;
      do {
        uVar12 = uVar12 - 1;
        if (pEVar8[2].type.id <= uVar12) {
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        loopSets._M_h._M_single_bucket = (__node_base_ptr)(*(long *)(pEVar8 + 2) + lVar11);
        std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
        emplace_back<wasm::Expression**>
                  ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)&p_Stack_58,
                   (Expression ***)this_00);
        lVar11 = lVar11 + -8;
        uVar10 = extraout_RDX_00;
        this_02 = local_80;
      } while (lVar11 != -8);
    }
    goto LAB_00945ec5;
  }
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)this_00,
             &((this_02->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
               ).super_Pass.runner)->options,
             (this_02->
             super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
             ).
             super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
             .
             super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
             .
             super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
             .currModule,pEVar8);
  if ((((finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl
         .super__Vector_impl_data._M_finish._4_1_ == '\0') && (local_13d == '\0')) &&
      (local_f0._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
     (local_120._M_impl.super__Rb_tree_header._M_node_count == 0)) {
    bVar6 = interestingToMove(this_02,local_38);
    if (bVar6) {
      cVar13 = '\x01';
      if (((((local_178._M_impl.super__Rb_tree_header._M_node_count == 0) && (local_147 == '\0')) &&
           ((local_145 == '\0' && ((local_143 == '\0' && (local_141 == '\0')))))) &&
          (local_13e == '\0')) &&
         ((finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
           _M_impl.super__Vector_impl_data._M_finish._5_1_ == '\0' &&
          (bVar6 = EffectAnalyzer::invalidates
                             ((EffectAnalyzer *)local_518,(EffectAnalyzer *)this_00), !bVar6)))) {
        if (((local_1a8._M_impl.super__Rb_tree_header._M_node_count == 0) &&
            (((local_148 == '\0' && (local_146 == '\0')) && (local_144 == '\0')))) &&
           (((local_142 == '\0' && (local_13e == '\0')) &&
            (finder.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
             _M_impl.super__Vector_impl_data._M_finish._5_1_ != '\x01')))) {
          cVar13 = '\0';
        }
        else if (((loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                   == (_Base_ptr)0x0) &&
                 (loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_
                  == '\0')) &&
                ((loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_
                  == '\0' &&
                 (((loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count.
                    _5_1_ == '\0' &&
                   (loopEffects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count.
                    _7_1_ == '\0')) && (loopEffects.readsTable == false)))))) {
          cVar13 = loopEffects.module._5_1_;
        }
      }
      if (((local_13d != '\0') || (local_f0._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
         ((cVar13 != '\0' ||
           (loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
            (_Base_ptr)0x0 || loopEffects.writesTable != false) ||
          ((local_1e0 != 0 &&
           (bVar6 = hasGetDependingOnLoopSet
                              (this_02,local_38,
                               (LoopSets *)
                               &loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count), bVar6)))))) goto LAB_00945e6e;
      FindAll<wasm::LocalSet>::FindAll((FindAll<wasm::LocalSet> *)&stack0xffffffffffffff68,local_38)
      ;
      pLVar7 = local_98;
      if (local_98 != set) {
        do {
          uVar10 = (ulong)*(uint *)&(*(_Hash_node_base **)
                                      &(pLVar7->super_SpecificExpression<(wasm::Expression::Id)9>).
                                       super_Expression)[2]._M_nxt;
          iVar3 = *(int *)(&(set_1->super_SpecificExpression<(wasm::Expression::Id)9>).
                            super_Expression._id + uVar10 * 4);
          if (iVar3 == 0) {
            __assert_fail("numSetsForIndex[set->index] > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LoopInvariantCodeMotion.cpp"
                          ,0x92,"void wasm::LoopInvariantCodeMotion::visitLoop(Loop *)");
          }
          *(int *)(&(set_1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id
                  + uVar10 * 4) = iVar3 + -1;
          pLVar7 = (LocalSet *)
                   &(pLVar7->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                    type;
          pLVar15 = local_98;
        } while (pLVar7 != set);
        for (; pLVar15 != set;
            pLVar15 = (LocalSet *)
                      &(pLVar15->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression
                       .type) {
          pLVar7 = local_98;
          if (*(int *)(&(set_1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                        _id + (ulong)*(uint *)&(*(_Hash_node_base **)
                                                 &(pLVar15->
                                                  super_SpecificExpression<(wasm::Expression::Id)9>)
                                                  .super_Expression)[2]._M_nxt * 4) != 0)
          goto LAB_00945dba;
        }
      }
      if (movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        _M_realloc_insert<wasm::Expression*const&>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78,
                   (iterator)
                   movedCode.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,&local_38);
      }
      else {
        *movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_start = local_38;
        movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
        _M_impl.super__Vector_impl_data._M_start =
             movedCode.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      pEVar8 = (Expression *)
               MixedArena::allocSpace
                         (&((this_02->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                            .
                            super_PostWalker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                            .
                            super_Walker<wasm::LoopInvariantCodeMotion,_wasm::Visitor<wasm::LoopInvariantCodeMotion,_void>_>
                           .currModule)->allocator,0x10,8);
      pLVar7 = set;
      pEVar8->_id = NopId;
      (pEVar8->type).id = 0;
      *ppEVar9 = pEVar8;
      if (local_98 == set) {
        bVar6 = true;
      }
      else {
        pLVar15 = local_98;
        do {
          local_c0 = *(_Hash_node_base **)
                      &(pLVar15->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression
          ;
          std::
          _Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase((_Hashtable<wasm::LocalSet_*,_wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)&loopEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                         _M_node_count,&local_c0);
          pLVar15 = (LocalSet *)
                    &(pLVar15->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.
                     type;
        } while (pLVar15 != pLVar7);
        bVar6 = true;
      }
      goto LAB_00945e52;
    }
    goto LAB_00945e6e;
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_f0);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_120);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_178);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_1a8);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_1d8);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&finder.list.
                  super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  uVar10 = extraout_RDX_02;
  goto LAB_00945f1d;
LAB_00945dba:
  do {
    pIVar2 = &(set_1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id +
             (ulong)*(uint *)&(*(_Hash_node_base **)
                                &(pLVar7->super_SpecificExpression<(wasm::Expression::Id)9>).
                                 super_Expression)[2]._M_nxt * 4;
    *(int *)pIVar2 = *(int *)pIVar2 + 1;
    pLVar7 = (LocalSet *)
             &(pLVar7->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type;
  } while (pLVar7 != set);
  bVar6 = false;
LAB_00945e52:
  if (local_98 != (LocalSet *)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  this_02 = local_80;
  if (!bVar6) {
LAB_00945e6e:
    EffectAnalyzer::mergeIn((EffectAnalyzer *)local_518,(EffectAnalyzer *)this_00);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_f0);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_120);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_178);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_1a8);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_1d8);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&finder.list.
                  super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  uVar10 = extraout_RDX_01;
LAB_00945ec5:
  if (p_Stack_58 ==
      (_Hashtable<wasm::LocalSet*,wasm::LocalSet*,std::allocator<wasm::LocalSet*>,std::__detail::_Identity,std::equal_to<wasm::LocalSet*>,std::hash<wasm::LocalSet*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
       *)work.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
         super__Vector_impl_data._M_start) goto LAB_00945f1d;
  goto LAB_00945b11;
}

Assistant:

void visitLoop(Loop* loop) {
    // We accumulate all the code we can move out, and will place it
    // in a block just preceding the loop.
    std::vector<Expression*> movedCode;
    // Accumulate effects of things we can't move out - things
    // we move out later must cross them, so we must verify it
    // is ok to do so.
    EffectAnalyzer effectsSoFar(getPassOptions(), *getModule());
    // The loop's total effects also matter. For example, a store
    // in the loop means we can't move a load outside.
    // FIXME: we look at the loop "tail" area too, after the last
    //        possible branch back, which can cause false positives
    //        for bad effect interactions.
    EffectAnalyzer loopEffects(getPassOptions(), *getModule(), loop);
    // Note all the sets in each loop, and how many per index. Currently
    // EffectAnalyzer can't do that, and we need it to know if we
    // can move a set out of the loop (if there is another set
    // still there, we can't). Another possible option here is for
    // LocalGraph to track interfering sets. TODO
    // FIXME: also the loop tail issue from above.
    auto numLocals = getFunction()->getNumLocals();
    std::vector<Index> numSetsForIndex(numLocals);
    LoopSets loopSets;
    {
      FindAll<LocalSet> finder(loop);
      for (auto* set : finder.list) {
        numSetsForIndex[set->index]++;
        loopSets.insert(set);
      }
    }
    // Walk along the loop entrance, while all the code there
    // is executed unconditionally. That is the code we want to
    // move out - anything that might or might not be executed
    // may be best left alone anyhow.
    std::vector<Expression**> work;
    work.push_back(&loop->body);
    while (!work.empty()) {
      auto** currp = work.back();
      work.pop_back();
      auto* curr = *currp;
      // Look into blocks.
      if (auto* block = curr->dynCast<Block>()) {
        auto& list = block->list;
        Index i = list.size();
        while (i > 0) {
          i--;
          work.push_back(&list[i]);
        }
        continue;
        // Note that if the block had a merge at the end, we would have seen
        // a branch to it anyhow, so we would stop before that point anyhow.
      }
      // If this may branch, we are done.
      EffectAnalyzer effects(getPassOptions(), *getModule(), curr);
      if (effects.transfersControlFlow()) {
        break;
      }
      if (interestingToMove(curr)) {
        // Let's see if we can move this out.
        // Global state changes would prevent this - we might end up
        // executing them just once.
        // And we must also move across anything not moved out already,
        // so check for issues there too.
        // The rest of the loop's effects matter too, we must also
        // take into account global state like interacting loads and
        // stores.
        bool unsafeToMove = effects.writesGlobalState() ||
                            effectsSoFar.invalidates(effects) ||
                            (effects.readsMutableGlobalState() &&
                             loopEffects.writesGlobalState());
        // TODO: look into optimizing this with exceptions. for now, disallow
        if (effects.throws() || loopEffects.throws()) {
          unsafeToMove = true;
        }
        if (!unsafeToMove) {
          // So far so good. Check if our local dependencies are all
          // outside of the loop, in which case everything is good -
          // either they are before the loop and constant for us, or
          // they are after and don't matter.
          if (effects.localsRead.empty() ||
              !hasGetDependingOnLoopSet(curr, loopSets)) {
            // We have checked if our gets are influenced by sets in the loop,
            // and must also check if our sets interfere with them. To do so,
            // assume temporarily that we are moving curr out; see if any sets
            // remain for its indexes.
            FindAll<LocalSet> currSets(curr);
            for (auto* set : currSets.list) {
              assert(numSetsForIndex[set->index] > 0);
              numSetsForIndex[set->index]--;
            }
            bool canMove = true;
            for (auto* set : currSets.list) {
              if (numSetsForIndex[set->index] > 0) {
                canMove = false;
                break;
              }
            }
            if (!canMove) {
              // We failed to move the code, undo those changes.
              for (auto* set : currSets.list) {
                numSetsForIndex[set->index]++;
              }
            } else {
              // We can move it! Leave the changes, move the code, and update
              // loopSets.
              movedCode.push_back(curr);
              *currp = Builder(*getModule()).makeNop();
              for (auto* set : currSets.list) {
                loopSets.erase(set);
              }
              continue;
            }
          }
        }
      }
      // We did not move this item. Accumulate its effects.
      effectsSoFar.mergeIn(effects);
    }
    // If we moved the code out, finish up by emitting it
    // outside of the loop.
    // Note that this works with nested loops - after moving outside
    // of an inner loop, we can encounter it again in an outer loop,
    // and move it further outside, without requiring any extra pass.
    if (!movedCode.empty()) {
      // Finish the moving by emitting the code outside.
      Builder builder(*getModule());
      auto* ret = builder.makeBlock(movedCode);
      ret->list.push_back(loop);
      ret->finalize(loop->type);
      replaceCurrent(ret);
      // Note that we do not need to modify the localGraph - we keep
      // each get in a position to be influenced by exactly the same
      // sets as before.
    }
  }